

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5UnicodeCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  byte bVar1;
  byte *z;
  int iVar2;
  Unicode61Tokenizer *p;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  u16 *puVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  
  if ((nArg & 1U) != 0) {
    return 1;
  }
  iVar2 = sqlite3_initialize();
  iVar10 = 7;
  if ((iVar2 == 0) &&
     (p = (Unicode61Tokenizer *)sqlite3Malloc(0xc0), p != (Unicode61Tokenizer *)0x0)) {
    memset(p,0,0xc0);
    p->nFold = 0x40;
    p->eRemoveDiacritic = 1;
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      pcVar3 = (char *)sqlite3Malloc(0x40);
      p->aFold = pcVar3;
      if (0 < nArg && pcVar3 != (char *)0x0) {
        pcVar4 = "L* N* Co";
        lVar7 = 0;
LAB_001f17e4:
        if (azArg[lVar7] != (char *)0x0) {
          lVar5 = 0;
          do {
            bVar1 = azArg[lVar7][lVar5];
            if (bVar1 == "categories"[lVar5]) {
              if ((ulong)bVar1 == 0) goto LAB_001f1815;
            }
            else if (""[bVar1] != ""[(byte)"categories"[lVar5]]) break;
            lVar5 = lVar5 + 1;
          } while( true );
        }
        goto LAB_001f181a;
      }
      pcVar4 = "L* N* Co";
LAB_001f182b:
      if (pcVar3 != (char *)0x0) {
        cVar9 = *pcVar4;
        if (cVar9 != '\0') {
          iVar10 = 1;
LAB_001f1872:
          if (cVar9 != '\0') {
            if ((cVar9 == ' ') || (cVar9 == '\t')) {
              cVar9 = pcVar4[1];
              pcVar4 = pcVar4 + 1;
              goto LAB_001f1872;
            }
            p->aCategory[0] = '\x01';
            switch(*pcVar4) {
            case 'L':
              cVar9 = pcVar4[1];
              switch(cVar9) {
              case 'l':
                p->aCategory[5] = '\x01';
                break;
              case 'm':
                p->aCategory[6] = '\x01';
                break;
              case 'n':
              case 'p':
              case 'q':
              case 'r':
              case 's':
                goto switchD_001f18b0_caseD_4f;
              case 'o':
                p->aCategory[7] = '\x01';
                break;
              case 't':
                p->aCategory[8] = '\x01';
                break;
              case 'u':
                p->aCategory[9] = '\x01';
                break;
              default:
                if (cVar9 == '*') {
                  p->aCategory[0x1e] = '\x01';
                  builtin_memcpy(p->aCategory + 5,"\x01\x01\x01\x01\x01",5);
                }
                else {
                  if (cVar9 != 'C') goto switchD_001f18b0_caseD_4f;
                  p->aCategory[0x1e] = '\x01';
                }
              }
              break;
            case 'M':
              bVar1 = pcVar4[1];
              if (bVar1 < 0x65) {
                if (bVar1 == 0x2a) {
                  p->aCategory[10] = '\x01';
                  p->aCategory[0xb] = '\x01';
LAB_001f1ac2:
                  p->aCategory[0xc] = '\x01';
                }
                else {
                  if (bVar1 != 99) goto switchD_001f18b0_caseD_4f;
                  p->aCategory[10] = '\x01';
                }
              }
              else {
                if (bVar1 != 0x65) {
                  if (bVar1 == 0x6e) goto LAB_001f1ac2;
                  goto switchD_001f18b0_caseD_4f;
                }
                p->aCategory[0xb] = '\x01';
              }
              break;
            case 'N':
              bVar1 = pcVar4[1];
              if (bVar1 < 0x6c) {
                if (bVar1 == 0x2a) {
                  p->aCategory[0xd] = '\x01';
                  p->aCategory[0xe] = '\x01';
LAB_001f1ae6:
                  p->aCategory[0xf] = '\x01';
                }
                else {
                  if (bVar1 != 100) goto switchD_001f18b0_caseD_4f;
                  p->aCategory[0xd] = '\x01';
                }
              }
              else {
                if (bVar1 != 0x6c) {
                  if (bVar1 == 0x6f) goto LAB_001f1ae6;
                  goto switchD_001f18b0_caseD_4f;
                }
                p->aCategory[0xe] = '\x01';
              }
              break;
            case 'O':
            case 'Q':
            case 'R':
            case 'T':
            case 'U':
            case 'V':
            case 'W':
            case 'X':
            case 'Y':
              goto switchD_001f18b0_caseD_4f;
            case 'P':
              switch(pcVar4[1]) {
              case 'c':
                p->aCategory[0x10] = '\x01';
                break;
              case 'd':
                p->aCategory[0x11] = '\x01';
                break;
              case 'e':
                p->aCategory[0x12] = '\x01';
                break;
              case 'f':
                p->aCategory[0x13] = '\x01';
                break;
              case 'g':
              case 'h':
              case 'j':
              case 'k':
              case 'l':
              case 'm':
              case 'n':
              case 'p':
              case 'q':
              case 'r':
                goto switchD_001f18b0_caseD_4f;
              case 'i':
                p->aCategory[0x14] = '\x01';
                break;
              case 'o':
                p->aCategory[0x15] = '\x01';
                break;
              case 's':
                p->aCategory[0x16] = '\x01';
                break;
              default:
                if (pcVar4[1] != '*') goto switchD_001f18b0_caseD_4f;
                builtin_memcpy(p->aCategory + 0x10,"\x01\x01\x01\x01\x01\x01\x01",7);
              }
              break;
            case 'S':
              bVar1 = pcVar4[1];
              if (bVar1 < 0x6b) {
                if (bVar1 == 0x2a) {
                  builtin_memcpy(p->aCategory + 0x17,"\x01\x01\x01\x01",4);
                }
                else {
                  if (bVar1 != 99) goto switchD_001f18b0_caseD_4f;
                  p->aCategory[0x17] = '\x01';
                }
              }
              else if (bVar1 == 0x6b) {
                p->aCategory[0x18] = '\x01';
              }
              else if (bVar1 == 0x6d) {
                p->aCategory[0x19] = '\x01';
              }
              else {
                if (bVar1 != 0x6f) goto switchD_001f18b0_caseD_4f;
                p->aCategory[0x1a] = '\x01';
              }
              break;
            case 'Z':
              bVar1 = pcVar4[1];
              if (bVar1 < 0x70) {
                if (bVar1 == 0x2a) {
                  p->aCategory[0x1b] = '\x01';
                  p->aCategory[0x1c] = '\x01';
LAB_001f1b0a:
                  p->aCategory[0x1d] = '\x01';
                }
                else {
                  if (bVar1 != 0x6c) goto switchD_001f18b0_caseD_4f;
                  p->aCategory[0x1b] = '\x01';
                }
              }
              else {
                if (bVar1 != 0x70) {
                  if (bVar1 == 0x73) goto LAB_001f1b0a;
                  goto switchD_001f18b0_caseD_4f;
                }
                p->aCategory[0x1c] = '\x01';
              }
              break;
            default:
              if (*pcVar4 != 'C') goto switchD_001f18b0_caseD_4f;
              bVar1 = pcVar4[1];
              if (bVar1 < 0x6e) {
                if (bVar1 == 0x2a) {
                  p->aCategory[0x1f] = '\x01';
                  builtin_memcpy(p->aCategory + 1,"\x01\x01\x01\x01",4);
                }
                else if (bVar1 == 99) {
                  p->aCategory[1] = '\x01';
                }
                else {
                  if (bVar1 != 0x66) goto switchD_001f18b0_caseD_4f;
                  p->aCategory[2] = '\x01';
                }
              }
              else if (bVar1 == 0x6e) {
                p->aCategory[3] = '\x01';
              }
              else if (bVar1 == 0x6f) {
                p->aCategory[0x1f] = '\x01';
              }
              else {
                if (bVar1 != 0x73) goto switchD_001f18b0_caseD_4f;
                p->aCategory[4] = '\x01';
              }
            }
          }
          while( true ) {
            cVar9 = *pcVar4;
            if (cVar9 == '\0') goto LAB_001f1c3b;
            if ((cVar9 == '\t') || (cVar9 == ' ')) break;
            pcVar4 = pcVar4 + 1;
          }
          goto LAB_001f1872;
        }
LAB_001f1c3b:
        uVar6 = 0;
        puVar8 = aFts5UnicodeData;
        do {
          uVar11 = (*puVar8 >> 5) + uVar6;
          if (0x7f < (int)uVar11) {
            uVar11 = 0x80;
          }
          if ((int)uVar6 < (int)uVar11) {
            memset(p->aTokenChar + (int)uVar6,(uint)p->aCategory[*puVar8 & 0x1f],
                   (ulong)(~uVar6 + uVar11) + 1);
            uVar6 = uVar11;
          }
          puVar8 = puVar8 + 1;
        } while ((int)uVar6 < 0x80);
        p->aTokenChar[0] = '\0';
        if (0 < nArg) {
          lVar7 = 0;
          iVar10 = 1;
LAB_001f1cde:
          pcVar3 = azArg[lVar7];
          if (pcVar3 != (char *)0x0) {
            z = (byte *)azArg[lVar7 + 1];
            lVar5 = 0;
            do {
              bVar1 = pcVar3[lVar5];
              if (bVar1 == "remove_diacritics"[lVar5]) {
                if ((ulong)bVar1 == 0) goto LAB_001f1d1a;
              }
              else if (""[bVar1] != ""[(byte)"remove_diacritics"[lVar5]]) {
                lVar5 = 0;
                goto LAB_001f1d43;
              }
              lVar5 = lVar5 + 1;
            } while( true );
          }
          goto switchD_001f18b0_caseD_4f;
        }
        goto LAB_001f1e05;
      }
    }
    else {
      p->aFold = (char *)0x0;
    }
  }
  else {
    p = (Unicode61Tokenizer *)0x0;
  }
switchD_001f18b0_caseD_4f:
  fts5UnicodeDelete((Fts5Tokenizer *)p);
  p = (Unicode61Tokenizer *)0x0;
LAB_001f174f:
  *ppOut = (Fts5Tokenizer *)p;
  return iVar10;
LAB_001f1815:
  pcVar4 = azArg[lVar7 + 1];
LAB_001f181a:
  lVar7 = lVar7 + 2;
  if (nArg <= (int)lVar7) goto LAB_001f182b;
  goto LAB_001f17e4;
LAB_001f1d43:
  bVar1 = pcVar3[lVar5];
  if (bVar1 == "tokenchars"[lVar5]) {
    if ((ulong)bVar1 == 0) goto LAB_001f1d66;
  }
  else if (""[bVar1] != ""[(byte)"tokenchars"[lVar5]]) {
    lVar5 = 0;
    goto LAB_001f1d72;
  }
  lVar5 = lVar5 + 1;
  goto LAB_001f1d43;
LAB_001f1d72:
  bVar1 = pcVar3[lVar5];
  if (bVar1 == "separators"[lVar5]) {
    if ((ulong)bVar1 == 0) goto LAB_001f1d96;
  }
  else if (""[bVar1] != ""[(byte)"separators"[lVar5]]) {
    lVar5 = 0;
    goto LAB_001f1dc5;
  }
  lVar5 = lVar5 + 1;
  goto LAB_001f1d72;
LAB_001f1dc5:
  bVar1 = pcVar3[lVar5];
  if (bVar1 == "categories"[lVar5]) {
    if ((ulong)bVar1 == 0) goto LAB_001f1d3d;
  }
  else if (""[bVar1] != ""[(byte)"categories"[lVar5]]) goto switchD_001f18b0_caseD_4f;
  lVar5 = lVar5 + 1;
  goto LAB_001f1dc5;
LAB_001f1d96:
  iVar2 = 0;
  goto LAB_001f1d9b;
LAB_001f1d66:
  iVar2 = 1;
LAB_001f1d9b:
  iVar2 = fts5UnicodeAddExceptions(p,(char *)z,iVar2);
LAB_001f1dae:
  if ((iVar2 != 0) || (lVar7 = lVar7 + 2, nArg <= (int)lVar7)) goto LAB_001f1df5;
  goto LAB_001f1cde;
LAB_001f1d1a:
  if ((2 < (byte)(*z - 0x30)) || (z[1] != 0)) goto switchD_001f18b0_caseD_4f;
  p->eRemoveDiacritic = *z - 0x30;
LAB_001f1d3d:
  iVar2 = 0;
  goto LAB_001f1dae;
LAB_001f1df5:
  iVar10 = iVar2;
  if (iVar2 == 0) {
LAB_001f1e05:
    iVar10 = 0;
    goto LAB_001f174f;
  }
  goto switchD_001f18b0_caseD_4f;
}

Assistant:

static int fts5UnicodeCreate(
  void *pUnused,
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;             /* Return code */
  Unicode61Tokenizer *p = 0;      /* New tokenizer object */

  UNUSED_PARAM(pUnused);

  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = (Unicode61Tokenizer*)sqlite3_malloc(sizeof(Unicode61Tokenizer));
    if( p ){
      const char *zCat = "L* N* Co";
      int i;
      memset(p, 0, sizeof(Unicode61Tokenizer));

      p->eRemoveDiacritic = FTS5_REMOVE_DIACRITICS_SIMPLE;
      p->nFold = 64;
      p->aFold = sqlite3_malloc64(p->nFold * sizeof(char));
      if( p->aFold==0 ){
        rc = SQLITE_NOMEM;
      }

      /* Search for a "categories" argument */
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          zCat = azArg[i+1];
        }
      }
      if( rc==SQLITE_OK ){
        rc = unicodeSetCategories(p, zCat);
      }

      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "remove_diacritics") ){
          if( (zArg[0]!='0' && zArg[0]!='1' && zArg[0]!='2') || zArg[1] ){
            rc = SQLITE_ERROR;
          }else{
            p->eRemoveDiacritic = (zArg[0] - '0');
            assert( p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_NONE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_SIMPLE
                 || p->eRemoveDiacritic==FTS5_REMOVE_DIACRITICS_COMPLEX
            );
          }
        }else
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          rc = fts5UnicodeAddExceptions(p, zArg, 0);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "categories") ){
          /* no-op */
        }else{
          rc = SQLITE_ERROR;
        }
      }
    }else{
      rc = SQLITE_NOMEM;
    }
    if( rc!=SQLITE_OK ){
      fts5UnicodeDelete((Fts5Tokenizer*)p);
      p = 0;
    }
    *ppOut = (Fts5Tokenizer*)p;
  }
  return rc;
}